

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatSpace(SUNMatrix A,int myid)

{
  long local_40;
  long leniw;
  long lenrw;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  SUNMatrix A_local;
  
  start_time._4_4_ = myid;
  _failure = A;
  stop_time = get_time();
  start_time._0_4_ = SUNMatSpace(_failure,&leniw,&local_40);
  lenrw = (long)get_time();
  if (start_time._0_4_ == 0) {
    if ((start_time._4_4_ == 0) &&
       (printf("    PASSED test -- SUNMatSpace, lenrw = %li, leniw = %li\n",leniw,local_40),
       print_time != 0)) {
      printf("    SUNMatSpace Time: %22.15e \n \n",(double)lenrw - stop_time);
    }
    A_local._4_4_ = 0;
  }
  else {
    printf(">>> FAILED test -- SUNMatSpace, Proc %d \n",(ulong)start_time._4_4_);
    if (print_time != 0) {
      printf("    SUNMatSpace Time: %22.15e \n \n",(double)lenrw - stop_time);
    }
    A_local._4_4_ = 1;
  }
  return A_local._4_4_;
}

Assistant:

int Test_SUNMatSpace(SUNMatrix A, int myid)
{
  int      failure;
  double   start_time, stop_time;
  long int lenrw, leniw;

  start_time = get_time();
  failure = SUNMatSpace(A, &lenrw, &leniw);
  stop_time = get_time();

  if (failure) {
    printf(">>> FAILED test -- SUNMatSpace, Proc %d \n", myid);
    PRINT_TIME("    SUNMatSpace Time: %22.15e \n \n", stop_time - start_time);
    return(1);
  } else if (myid == 0) {
    printf("    PASSED test -- SUNMatSpace, lenrw = %li, leniw = %li\n", lenrw, leniw);
    PRINT_TIME("    SUNMatSpace Time: %22.15e \n \n", stop_time - start_time);
  }

  return(0);
}